

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation.cc
# Opt level: O0

int TraceFd(void)

{
  int fd;
  time_t tVar1;
  bool bVar2;
  char *pcStack_10;
  bool fallback_to_stderr;
  char *val;
  
  if (TraceFd::trace_fd == -1) {
    pcStack_10 = getenv("TCMALLOC_TRACE_FILE");
    bVar2 = pcStack_10 == (char *)0x0;
    if (bVar2) {
      pcStack_10 = "/tmp/google.alloc";
    }
    TraceFd::trace_fd = open(pcStack_10,0x241,0x1b6);
    if (TraceFd::trace_fd == -1) {
      if (bVar2) {
        TraceFd::trace_fd = 2;
        TracePrintf(2,"Can\'t open %s.  Logging to stderr.\n",pcStack_10);
      }
      else {
        TracePrintf(2,"Can\'t open %s.  Logging disabled.\n",pcStack_10);
      }
    }
    fd = TraceFd::trace_fd;
    tVar1 = time((time_t *)0x0);
    TracePrintf(fd,"Trace started: %lu\n",tVar1);
    TracePrintf(TraceFd::trace_fd,"func\tsize\tptr\tthread_id\tstack pcs for tools/symbolize\n");
  }
  return TraceFd::trace_fd;
}

Assistant:

static int TraceFd() {
  static int trace_fd = -1;
  if (trace_fd == -1) {            // Open the trace file on the first call
    const char *val = getenv("TCMALLOC_TRACE_FILE");
    bool fallback_to_stderr = false;
    if (!val) {
      val = "/tmp/google.alloc";
      fallback_to_stderr = true;
    }
    trace_fd = open(val, O_CREAT|O_TRUNC|O_WRONLY, 0666);
    if (trace_fd == -1) {
      if (fallback_to_stderr) {
        trace_fd = 2;
        TracePrintf(trace_fd, "Can't open %s.  Logging to stderr.\n", val);
      } else {
        TracePrintf(2, "Can't open %s.  Logging disabled.\n", val);
      }
    }
    // Add a header to the log.
    TracePrintf(trace_fd, "Trace started: %lu\n",
                static_cast<unsigned long>(time(nullptr)));
    TracePrintf(trace_fd,
                "func\tsize\tptr\tthread_id\tstack pcs for tools/symbolize\n");
  }
  return trace_fd;
}